

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::RadixHTLocalSourceState::Finalize
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate)

{
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *puVar1;
  pointer *ppLVar2;
  atomic<unsigned_long> *paVar3;
  __int_type _Var4;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var5;
  RadixHTGlobalSinkState *pRVar6;
  RadixHTLocalSourceState *pRVar7;
  int32_t val;
  int iVar8;
  reference this_00;
  type this_01;
  pointer pGVar9;
  idx_t *piVar10;
  ulong uVar11;
  TaskScheduler *this_02;
  unsigned_long uVar12;
  undefined4 extraout_var;
  idx_t iVar13;
  pointer pLVar14;
  type pTVar15;
  BufferManager *pBVar16;
  TupleDataCollection *this_03;
  pointer pTVar17;
  pointer this_04;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar18;
  pointer this_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer *__ptr;
  pointer radix_bits;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> partition_guard;
  undefined1 local_78 [24];
  element_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  RadixHTGlobalSinkState *local_50;
  pointer local_48;
  RadixHTGlobalSourceState *local_40;
  RadixHTLocalSourceState *local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
            ::operator[](&sink->partitions,this->task_idx);
  this_01 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
            ::operator*(this_00);
  _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->ht;
  local_58._M_pi = _Var19._M_pi;
  local_50 = sink;
  local_38 = this;
  if ((this->ht).
      super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
      .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl ==
      (GroupedAggregateHashTable *)0x0) {
    puVar1 = &this_01->data;
    pTVar17 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    piVar10 = TupleDataCollection::Count(pTVar17);
    uVar11 = *piVar10;
    if (uVar11 < 0x1001) {
      uVar11 = 0x1000;
    }
    auVar20._8_4_ = (int)(uVar11 >> 0x20);
    auVar20._0_8_ = uVar11;
    auVar20._12_4_ = 0x45300000;
    dVar23 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 1.25;
    uVar11 = (ulong)dVar23;
    local_48 = (pointer)NextPowerOfTwo((long)(dVar23 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f
                                       | uVar11);
    this_02 = TaskScheduler::GetScheduler(gstate->context);
    val = TaskScheduler::NumberOfThreads(this_02);
    uVar12 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    pBVar16 = BufferManager::GetBufferManager(gstate->context);
    iVar8 = (*pBVar16->_vptr_BufferManager[0xb])(pBVar16);
    auVar21._4_4_ = extraout_var;
    auVar21._0_4_ = iVar8;
    auVar21._8_4_ = extraout_var;
    auVar21._12_4_ = 0x45300000;
    auVar22._8_4_ = (int)(uVar12 >> 0x20);
    auVar22._0_8_ = uVar12;
    auVar22._12_4_ = 0x45300000;
    dVar23 = (((auVar21._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 0.6) /
             ((auVar22._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0));
    uVar11 = (ulong)dVar23;
    local_40 = gstate;
    pTVar17 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    iVar13 = TupleDataCollection::SizeInBytes(pTVar17);
    pTVar17 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(puVar1);
    piVar10 = TupleDataCollection::Count(pTVar17);
    gstate = local_40;
    pLVar14 = (pointer)NextPowerOfTwo(((long)(dVar23 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f
                                      | uVar11) /
                                      (iVar13 / (*piVar10 + (ulong)(*piVar10 == 0)) + 10));
    _Var19._M_pi = local_58._M_pi;
    radix_bits = (pointer)0x1000;
    if ((pointer)0x1000 < pLVar14) {
      radix_bits = pLVar14;
    }
    if (local_48 < radix_bits) {
      radix_bits = local_48;
    }
    RadixPartitionedHashTable::CreateHT
              ((RadixPartitionedHashTable *)local_78,(ClientContext *)sink->radix_ht,
               (idx_t)gstate->context,(idx_t)radix_bits);
    _Var5._M_head_impl =
         ((_Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> *)
         &(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)&(_Var19._M_pi)->_vptr__Sp_counted_base)->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl;
    ((_Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> *)
    &(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        *)&(_Var19._M_pi)->_vptr__Sp_counted_base)->
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ).
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl =
         (GroupedAggregateHashTable *)local_78._0_8_;
    if (_Var5._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
  }
  else {
    pGVar9 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
             ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                           *)_Var19._M_pi);
    GroupedAggregateHashTable::Abandon(pGVar9);
  }
  pGVar9 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                         *)_Var19._M_pi);
  puVar1 = &this_01->data;
  pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*(puVar1);
  GroupedAggregateHashTable::Combine
            (pGVar9,pTVar15,(optional_ptr<std::atomic<double>,_true>)&this_01->progress);
  LOCK();
  (this_01->progress)._M_i = 1.0;
  UNLOCK();
  pBVar16 = BufferManager::GetBufferManager(gstate->context);
  local_78._0_8_ =
       (local_50->radix_ht->layout_ptr).internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78._8_8_ =
       (local_50->radix_ht->layout_ptr).internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count + 1;
    }
  }
  this_03 = (TupleDataCollection *)operator_new(0x88);
  TupleDataCollection::TupleDataCollection
            (this_03,pBVar16,(shared_ptr<duckdb::TupleDataLayout,_true> *)local_78);
  _Var19._M_pi = local_58._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
  }
  ::std::
  __uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>::
  reset((__uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
         *)puVar1,this_03);
  pTVar17 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator->(puVar1);
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                *)_Var19._M_pi);
  GroupedAggregateHashTable::AcquirePartitionedData((GroupedAggregateHashTable *)local_78);
  this_04 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
            ::operator->((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                          *)local_78);
  pRVar6 = local_50;
  puVar18 = PartitionedTupleData::GetPartitions(this_04);
  pTVar15 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
            ::operator*((puVar18->
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  TupleDataCollection::Combine(pTVar17,pTVar15);
  if ((_Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>)local_78._0_8_ !=
      (_Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>)0x0) {
    (**(code **)((long)(((vector<duckdb::LogicalType,_true> *)local_78._0_8_)->
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
  local_78._0_8_ = &(pRVar6->super_GlobalSinkState).super_StateWithBlockableTasks.lock;
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_78);
  local_78[8] = 1;
  pGVar9 = unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
           ::operator->((unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
                         *)_Var19._M_pi);
  pRVar7 = local_38;
  local_78._16_8_ =
       (pGVar9->aggregate_allocator).internal.
       super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60 = (element_type *)
             (pGVar9->aggregate_allocator).internal.
             super___shared_ptr<duckdb::ArenaAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_60 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ppLVar2 = &(local_60->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppLVar2 = *(int *)ppLVar2 + 1;
      UNLOCK();
    }
    else {
      ppLVar2 = &(local_60->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *(int *)ppLVar2 = *(int *)ppLVar2 + 1;
    }
  }
  ::std::
  vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>
            ((vector<duckdb::shared_ptr<duckdb::ArenaAllocator,true>,std::allocator<duckdb::shared_ptr<duckdb::ArenaAllocator,true>>>
              *)&pRVar6->stored_allocators,
             (shared_ptr<duckdb::ArenaAllocator,_true> *)(local_78 + 0x10));
  if (local_60 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60);
  }
  if (pRVar7->task_idx ==
      (long)(pRVar6->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pRVar6->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    _Var5._M_head_impl =
         ((_Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> *)
         &(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             *)&(_Var19._M_pi)->_vptr__Sp_counted_base)->
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl;
    ((_Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> *)
    &(((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
        *)&(_Var19._M_pi)->_vptr__Sp_counted_base)->
     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ).
     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl = (GroupedAggregateHashTable *)0x0;
    if (_Var5._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseAggregateHashTable + 8))();
    }
  }
  LOCK();
  paVar3 = &pRVar6->finalize_done;
  _Var4 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
  (paVar3->super___atomic_base<unsigned_long>)._M_i =
       (paVar3->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  if (_Var4 + 1 ==
      (long)(pRVar6->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pRVar6->partitions).
            super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    this_05 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
              ::operator->(&pRVar6->temporary_memory_state);
    TemporaryMemoryState::SetZero(this_05);
  }
  local_78._16_8_ = &(this_01->super_StateWithBlockableTasks).lock;
  local_60 = (element_type *)((ulong)local_60 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_78 + 0x10));
  local_60 = (element_type *)CONCAT71(local_60._1_7_,1);
  this_01->state = READY_TO_SCAN;
  StateWithBlockableTasks::UnblockTasks
            (&this_01->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)(local_78 + 0x10));
  pRVar7->task = SCAN;
  pRVar7->scan_status = INIT;
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_78 + 0x10));
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_78);
  return;
}

Assistant:

void RadixHTLocalSourceState::Finalize(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate) {
	D_ASSERT(task == RadixHTSourceTaskType::FINALIZE);
	D_ASSERT(scan_status != RadixHTScanStatus::IN_PROGRESS);
	auto &partition = *sink.partitions[task_idx];

	if (!ht) {
		// This capacity would always be sufficient for all data
		const auto capacity = GroupedAggregateHashTable::GetCapacityForCount(partition.data->Count());

		// However, we will limit the initial capacity so we don't do a huge over-allocation
		const auto n_threads = NumericCast<idx_t>(TaskScheduler::GetScheduler(gstate.context).NumberOfThreads());
		const auto memory_limit = BufferManager::GetBufferManager(gstate.context).GetMaxMemory();
		const idx_t thread_limit = LossyNumericCast<idx_t>(0.6 * double(memory_limit) / double(n_threads));

		const idx_t size_per_entry = partition.data->SizeInBytes() / MaxValue<idx_t>(partition.data->Count(), 1) +
		                             idx_t(GroupedAggregateHashTable::LOAD_FACTOR * sizeof(ht_entry_t));
		// but not lower than the initial capacity
		const auto capacity_limit =
		    MaxValue(NextPowerOfTwo(thread_limit / size_per_entry), GroupedAggregateHashTable::InitialCapacity());

		ht = sink.radix_ht.CreateHT(gstate.context, MinValue<idx_t>(capacity, capacity_limit), 0);
	} else {
		ht->Abandon();
	}

	// Now combine the uncombined data using this thread's HT
	ht->Combine(*partition.data, &partition.progress);
	partition.progress = 1;

	// Move the combined data back to the partition
	partition.data =
	    make_uniq<TupleDataCollection>(BufferManager::GetBufferManager(gstate.context), sink.radix_ht.GetLayoutPtr());
	partition.data->Combine(*ht->AcquirePartitionedData()->GetPartitions()[0]);

	// Update thread-global state
	auto guard = sink.Lock();
	sink.stored_allocators.emplace_back(ht->GetAggregateAllocator());
	if (task_idx == sink.partitions.size()) {
		ht.reset();
	}
	const auto finalizes_done = ++sink.finalize_done;
	D_ASSERT(finalizes_done <= sink.partitions.size());
	if (finalizes_done == sink.partitions.size()) {
		// All finalizes are done, set remaining size to 0
		sink.temporary_memory_state->SetZero();
	}

	// Update partition state
	auto partition_guard = partition.Lock();
	partition.state = AggregatePartitionState::READY_TO_SCAN;
	partition.UnblockTasks(partition_guard);

	// This thread will scan the partition
	task = RadixHTSourceTaskType::SCAN;
	scan_status = RadixHTScanStatus::INIT;
}